

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O2

void __thiscall
ot::commissioner::CommissionerImpl::CommandDiagReset
          (CommissionerImpl *this,ErrorHandler *aHandler,string *aAddr,uint64_t aDiagDataFlags)

{
  ErrorCode EVar1;
  int iVar2;
  Error *pEVar3;
  char *pcVar4;
  char *pcVar5;
  string *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  ResponseHandler *aHandler_00;
  format_args args;
  format_args args_00;
  format_args args_01;
  allocator local_209;
  undefined1 local_208 [8];
  _Alloc_hider local_200;
  size_type local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0;
  parse_func local_1e0 [1];
  string local_1d0;
  undefined1 local_1b0 [8];
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_1a8;
  Address dstAddr;
  Error error;
  anon_class_32_1_d0c21527 onResponse;
  undefined1 local_120 [40];
  ResponseHandler local_f8;
  ResponseHandler local_d8;
  Request request;
  
  error.mCode = kNone;
  error.mMessage._M_dataplus._M_p = (pointer)&error.mMessage.field_2;
  error.mMessage._M_string_length = 0;
  error.mMessage.field_2._M_local_buf[0] = '\0';
  dstAddr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  dstAddr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  dstAddr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  coap::Message::Message(&request,kConfirmable,kPost);
  std::function<void_(ot::commissioner::Error)>::function(&onResponse.aHandler,aHandler);
  iVar2 = (*(this->super_Commissioner)._vptr_Commissioner[9])(this);
  if ((char)iVar2 == '\0') {
    local_208._0_4_ = none_type;
    local_200._M_p = "commissioner is not active";
    local_1f8 = 0x1a;
    local_1f0._M_allocated_capacity = 0;
    local_1e0[0] = (parse_func)0x0;
    pcVar4 = "commissioner is not active";
    local_1f0._8_8_ =
         (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_208;
    while (pcVar5 = pcVar4, pcVar5 != "") {
      pcVar4 = pcVar5 + 1;
      if (*pcVar5 == '}') {
        if ((pcVar4 == "") || (*pcVar4 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar4 = pcVar5 + 2;
      }
      else if (*pcVar5 == '{') {
        pcVar4 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar5,"",
                            (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_208);
      }
    }
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_208;
    ::fmt::v10::vformat_abi_cxx11_(&local_1d0,(v10 *)0x2157e4,(string_view)ZEXT816(0x1a),args);
    local_1b0._0_4_ = kInvalidState;
    std::__cxx11::string::string((string *)&local_1a8,(string *)&local_1d0);
    Error::operator=(&error,(Error *)local_1b0);
    std::__cxx11::string::~string((string *)&local_1a8);
    this_00 = &local_1d0;
  }
  else {
    std::__cxx11::string::string((string *)local_1b0,"/d/dr",(allocator *)&local_1d0);
    coap::Message::SetUriPath((Error *)local_208,&request,(string *)local_1b0);
    pEVar3 = Error::operator=(&error,(Error *)local_208);
    EVar1 = pEVar3->mCode;
    std::__cxx11::string::~string((string *)&local_200);
    std::__cxx11::string::~string((string *)local_1b0);
    if (EVar1 != kNone) goto LAB_001971a3;
    GetNetDiagTlvTypes((ByteArray *)&local_1d0,aDiagDataFlags);
    tlv::Tlv::Tlv((Tlv *)local_1b0,kJoinerUdpPort,(ByteArray *)&local_1d0,kNetworkDiag);
    AppendTlv((Error *)local_208,&request,(Tlv *)local_1b0);
    pEVar3 = Error::operator=(&error,(Error *)local_208);
    EVar1 = pEVar3->mCode;
    std::__cxx11::string::~string((string *)&local_200);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_1a8);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1d0);
    if (EVar1 != kNone) goto LAB_001971a3;
    iVar2 = (*(this->super_Commissioner)._vptr_Commissioner[10])(this);
    if ((char)iVar2 != '\0') {
      SignRequest((Error *)local_208,this,&request,kMeshCoP,true);
      pEVar3 = Error::operator=(&error,(Error *)local_208);
      EVar1 = pEVar3->mCode;
      std::__cxx11::string::~string((string *)&local_200);
      if (EVar1 != kNone) goto LAB_001971a3;
    }
    std::__cxx11::string::string((string *)local_1b0,"meshdiag",&local_209);
    local_208._0_4_ = none_type;
    local_200._M_p = "sending DIAG_RST.ntf";
    local_1f8 = 0x14;
    local_1f0._M_allocated_capacity = 0;
    local_1e0[0] = (parse_func)0x0;
    pcVar4 = "sending DIAG_RST.ntf";
    local_1f0._8_8_ =
         (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_208;
    while (pcVar5 = pcVar4, pcVar5 != "") {
      pcVar4 = pcVar5 + 1;
      if (*pcVar5 == '}') {
        if ((pcVar4 == "") || (*pcVar4 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar4 = pcVar5 + 2;
      }
      else if (*pcVar5 == '{') {
        pcVar4 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar5,"",
                            (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_208);
      }
    }
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)local_208;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_1d0,(v10 *)"sending DIAG_RST.ntf",(string_view)ZEXT816(0x14),args_00);
    Log(kInfo,(string *)local_1b0,&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)local_1b0);
    if (aAddr->_M_string_length == 0) {
      aHandler_00 = &local_d8;
      std::function<void(ot::commissioner::coap::Message_const*,ot::commissioner::Error)>::
      function<ot::commissioner::CommissionerImpl::CommandDiagReset(std::function<void(ot::commissioner::Error)>,std::__cxx11::string_const&,unsigned_long)::__0&,void>
                ((function<void(ot::commissioner::coap::Message_const*,ot::commissioner::Error)> *)
                 aHandler_00,&onResponse);
      ProxyClient::SendRequest(&this->mProxyClient,&request,aHandler_00,0xfc00,0xf0bf);
    }
    else {
      Address::Set((Error *)local_208,&dstAddr,aAddr);
      pEVar3 = Error::operator=(&error,(Error *)local_208);
      EVar1 = pEVar3->mCode;
      std::__cxx11::string::~string((string *)&local_200);
      if (EVar1 != kNone) goto LAB_001971a3;
      aHandler_00 = &local_f8;
      std::function<void(ot::commissioner::coap::Message_const*,ot::commissioner::Error)>::
      function<ot::commissioner::CommissionerImpl::CommandDiagReset(std::function<void(ot::commissioner::Error)>,std::__cxx11::string_const&,unsigned_long)::__0&,void>
                ((function<void(ot::commissioner::coap::Message_const*,ot::commissioner::Error)> *)
                 aHandler_00,&onResponse);
      ProxyClient::SendRequest(&this->mProxyClient,&request,aHandler_00,&dstAddr,0xf0bf);
    }
    std::_Function_base::~_Function_base(&aHandler_00->super__Function_base);
    std::__cxx11::string::string((string *)local_1b0,"meshdiag",&local_209);
    local_208._0_4_ = none_type;
    local_200._M_p = "sent DIAG_RST.ntf";
    local_1f8 = 0x11;
    local_1f0._M_allocated_capacity = 0;
    local_1e0[0] = (parse_func)0x0;
    pcVar4 = "sent DIAG_RST.ntf";
    local_1f0._8_8_ =
         (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_208;
    while (pcVar5 = pcVar4, pcVar5 != "") {
      pcVar4 = pcVar5 + 1;
      if (*pcVar5 == '}') {
        if ((pcVar4 == "") || (*pcVar4 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar4 = pcVar5 + 2;
      }
      else if (*pcVar5 == '{') {
        pcVar4 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar5,"",
                            (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_208);
      }
    }
    args_01.field_1.args_ = in_R9.args_;
    args_01.desc_ = (unsigned_long_long)local_208;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_1d0,(v10 *)"sent DIAG_RST.ntf",(string_view)ZEXT816(0x11),args_01);
    Log(kInfo,(string *)local_1b0,&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    this_00 = (string *)local_1b0;
  }
  std::__cxx11::string::~string((string *)this_00);
LAB_001971a3:
  if (error.mCode != kNone) {
    Error::Error((Error *)local_120,&error);
    std::function<void_(ot::commissioner::Error)>::operator()(aHandler,(Error *)local_120);
    std::__cxx11::string::~string((string *)(local_120 + 8));
  }
  std::_Function_base::~_Function_base((_Function_base *)&onResponse);
  coap::Message::~Message(&request);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&dstAddr);
  std::__cxx11::string::~string((string *)&error.mMessage);
  return;
}

Assistant:

void CommissionerImpl::CommandDiagReset(ErrorHandler aHandler, const std::string &aAddr, uint64_t aDiagDataFlags)
{
    Error         error;
    Address       dstAddr;
    coap::Request request{coap::Type::kConfirmable, coap::Code::kPost};
    auto          onResponse = [aHandler](const coap::Response *aResponse, Error aError) {
        Error error;

        SuccessOrExit(error = aError);
        SuccessOrExit(error = CheckCoapResponseCode(*aResponse));

    exit:
        aHandler(error);
    };

    VerifyOrExit(IsActive(), error = ERROR_INVALID_STATE("commissioner is not active"));
    SuccessOrExit(error = request.SetUriPath(uri::kDiagRst));
    SuccessOrExit(error = AppendTlv(request, {tlv::Type::kNetworkDiagTypeList, GetNetDiagTlvTypes(aDiagDataFlags),
                                              tlv::Scope::kNetworkDiag}));

#if OT_COMM_CONFIG_CCM_ENABLE
    if (IsCcmMode())
    {
        SuccessOrExit(error = SignRequest(request));
    }
#endif

    LOG_INFO(LOG_REGION_MESHDIAG, "sending DIAG_RST.ntf");
    if (aAddr.empty())
    {
        mProxyClient.SendRequest(request, onResponse, kLeaderAloc16, kDefaultMmPort);
    }
    else
    {
        SuccessOrExit(error = dstAddr.Set(aAddr));
        mProxyClient.SendRequest(request, onResponse, dstAddr, kDefaultMmPort);
    }
    LOG_INFO(LOG_REGION_MESHDIAG, "sent DIAG_RST.ntf");

exit:
    if (error != ErrorCode::kNone)
    {
        aHandler(error);
    }
}